

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::initList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,ElementSize elementSize)

{
  uint uVar1;
  word *pwVar2;
  word *pwVar3;
  AllocateResult AVar4;
  anon_class_1_0_00000001 local_29;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  uVar1 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::ElementSize,capnp::_::BuilderArena*)::_lambda()_1_>
                    (elementCount,&local_29);
  AVar4 = BuilderArena::allocate
                    (arena,(SegmentWordCount)
                           ((ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE +
                                            (ulong)(uint)elementSize * 4) * (ulong)uVar1 + 0x3f >> 6
                           ));
  pwVar3 = AVar4.words;
  *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
  *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar1 << 3 | (uint)elementSize;
  __return_storage_ptr__->segment = AVar4.segment;
  __return_storage_ptr__->capTable = capTable;
  pwVar2 = pwVar3 + -1;
  if (pwVar3 == (word *)0x0) {
    pwVar2 = pwVar3;
  }
  if (elementSize != INLINE_COMPOSITE) {
    pwVar2 = pwVar3;
  }
  __return_storage_ptr__->location = pwVar2;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, ElementSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}